

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeIntegerDebugType(Builder *this,int width,bool hasSign)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  ulong uVar1;
  Id *pIVar2;
  iterator __position;
  bool bVar3;
  _Alloc_hider _Var4;
  Builder *this_01;
  Id IVar5;
  Id IVar6;
  char *pcVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  Instruction *pIVar10;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_02;
  int iVar11;
  long lVar12;
  undefined7 in_register_00000011;
  Id IVar13;
  long lVar14;
  char *__s;
  Instruction *type;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  Id local_64;
  string local_60;
  undefined4 local_3c;
  Builder *local_38;
  
  if (width == 0x40) {
    pcVar7 = "int64_t";
    __s = "uint64_t";
  }
  else if (width == 0x10) {
    pcVar7 = "int16_t";
    __s = "uint16_t";
  }
  else if (width == 8) {
    pcVar7 = "int8_t";
    __s = "uint8_t";
  }
  else {
    pcVar7 = "int";
    __s = "uint";
  }
  if (hasSign) {
    __s = pcVar7;
  }
  local_64 = width;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  sVar8 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar8);
  IVar5 = getStringId(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  this_00 = &this->groupedDebugTypes;
  local_70._M_head_impl._0_4_ = 2;
  local_38 = this;
  pmVar9 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_70);
  iVar11 = (int)((ulong)((long)(pmVar9->
                               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pmVar9->
                              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3);
  bVar3 = 0 < iVar11;
  local_3c = (undefined4)CONCAT71(in_register_00000011,hasSign);
  if (0 < iVar11) {
    lVar14 = 0;
    do {
      local_70._M_head_impl._0_4_ = 2;
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_70);
      local_60._M_dataplus._M_p =
           (pointer)(pmVar9->
                    super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar14];
      uVar1 = **(ulong **)
                &(((Instruction *)local_60._M_dataplus._M_p)->idOperand).
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data;
      if ((uVar1 & 1) == 0) {
LAB_0045ab16:
        __assert_fail("idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
      }
      pIVar2 = (((Instruction *)local_60._M_dataplus._M_p)->operands).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*pIVar2 == IVar5) {
        if ((uVar1 & 2) == 0) goto LAB_0045ab16;
        if (pIVar2[1] == local_64) {
          if ((uVar1 & 4) == 0) goto LAB_0045ab16;
          if (pIVar2[2] == (uint)!hasSign * 2 + 4) {
            pmVar9 = (mapped_type *)(ulong)((Instruction *)local_60._M_dataplus._M_p)->resultId;
            break;
          }
        }
      }
      lVar14 = lVar14 + 1;
      local_70._M_head_impl._0_4_ = 2;
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_70);
      lVar12 = (long)(int)((ulong)((long)(pmVar9->
                                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pmVar9->
                                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3);
      bVar3 = lVar14 < lVar12;
    } while (lVar14 < lVar12);
  }
  IVar6 = (Id)pmVar9;
  if (!bVar3) {
    pIVar10 = (Instruction *)operator_new(0x60);
    this_01 = local_38;
    IVar13 = local_38->uniqueId + 1;
    local_38->uniqueId = IVar13;
    IVar6 = makeVoidType(local_38);
    pIVar10->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
    pIVar10->resultId = IVar13;
    pIVar10->typeId = IVar6;
    pIVar10->opCode = OpExtInst;
    (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    (pIVar10->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar10->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar10->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    pIVar10->block = (Block *)0x0;
    local_60._M_dataplus._M_p = (pointer)pIVar10;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar10->operands,6);
    if ((pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage ==
        (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
      std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar10->idOperand,6);
    }
    Instruction::addIdOperand
              ((Instruction *)local_60._M_dataplus._M_p,this_01->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand((Instruction *)local_60._M_dataplus._M_p,2);
    Instruction::addIdOperand((Instruction *)local_60._M_dataplus._M_p,IVar5);
    _Var4._M_p = local_60._M_dataplus._M_p;
    IVar5 = makeIntegerType(this_01,0x20,false);
    IVar5 = makeIntConstant(this_01,IVar5,local_64,false);
    Instruction::addIdOperand((Instruction *)_Var4._M_p,IVar5);
    _Var4._M_p = local_60._M_dataplus._M_p;
    IVar5 = makeIntegerType(this_01,0x20,false);
    IVar5 = makeIntConstant(this_01,IVar5,(uint)(byte)((byte)local_3c ^ 1) * 2 + 4,false);
    Instruction::addIdOperand((Instruction *)_Var4._M_p,IVar5);
    _Var4._M_p = local_60._M_dataplus._M_p;
    IVar5 = makeIntegerType(this_01,0x20,false);
    IVar5 = makeIntConstant(this_01,IVar5,0,false);
    Instruction::addIdOperand((Instruction *)_Var4._M_p,IVar5);
    local_70._M_head_impl._0_4_ = 2;
    this_02 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
              std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_00,(key_type *)&local_70);
    __position._M_current = *(Instruction ***)(this_02 + 8);
    if (__position._M_current == *(Instruction ***)(this_02 + 0x10)) {
      std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>(this_02,__position,(Instruction **)&local_60);
    }
    else {
      *__position._M_current = (Instruction *)local_60._M_dataplus._M_p;
      *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 8;
    }
    local_70._M_head_impl = (Instruction *)local_60._M_dataplus._M_p;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this_01->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_70);
    if (local_70._M_head_impl != (Instruction *)0x0) {
      (*(local_70._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this_01->module,(Instruction *)local_60._M_dataplus._M_p);
    IVar6 = *(Id *)(local_60._M_dataplus._M_p + 8);
  }
  return IVar6;
}

Assistant:

Id Builder::makeIntegerDebugType(int const width, bool const hasSign)
{
    const char* typeName = nullptr;
    switch (width) {
        case 8:  typeName = hasSign ? "int8_t" : "uint8_t"; break;
        case 16: typeName = hasSign ? "int16_t" : "uint16_t"; break;
        case 64: typeName = hasSign ? "int64_t" : "uint64_t"; break;
        default: typeName = hasSign ? "int" : "uint";
    }
    auto nameId = getStringId(typeName);
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].size(); ++t) {
        type = groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic][t];
        if (type->getIdOperand(0) == nameId &&
            type->getIdOperand(1) == static_cast<unsigned int>(width) &&
            type->getIdOperand(2) == (hasSign ? NonSemanticShaderDebugInfo100Signed : NonSemanticShaderDebugInfo100Unsigned))
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(6);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeBasic);
    type->addIdOperand(nameId); // name id
    type->addIdOperand(makeUintConstant(width)); // size id
    if(hasSign == true) {
        type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100Signed)); // encoding id
    } else {
        type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100Unsigned)); // encoding id
    }
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100None)); // flags id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}